

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void test_qclab_qgates_QGate1<double>(void)

{
  allocator<double> *paVar1;
  undefined1 *this;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_1240;
  AssertHelper local_1220;
  Message local_1218;
  SquareMatrix<double> local_1210;
  SquareMatrix<double> local_1200;
  bool local_11e9;
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar__31;
  SquareMatrix<double> mat3_3;
  AssertHelper local_11a8;
  Message local_11a0;
  SquareMatrix<double> local_1198;
  bool local_1181;
  undefined1 local_1180 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_1150;
  Message local_1148;
  SquareMatrix<double> local_1140;
  bool local_1129;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar__29;
  SquareMatrix<double> mat2_3;
  AssertHelper local_10e8;
  Message local_10e0;
  bool local_10d1;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar__28;
  M check1_5;
  string local_10a0;
  AssertHelper local_1080;
  Message local_1078;
  bool local_1069;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar__27;
  SquareMatrix<double> mat1_3;
  undefined1 local_1038 [8];
  M Ytrans_1;
  RotationY<double> Y_2;
  AssertHelper local_fe8;
  Message local_fe0;
  SquareMatrix<double> local_fd8;
  SquareMatrix<double> local_fc8;
  bool local_fb1;
  undefined1 local_fb0 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<double> mat3_2;
  AssertHelper local_f70;
  Message local_f68;
  SquareMatrix<double> local_f60;
  bool local_f49;
  undefined1 local_f48 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_f18;
  Message local_f10;
  SquareMatrix<double> local_f08;
  bool local_ef1;
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar__24;
  SquareMatrix<double> mat2_2;
  AssertHelper local_eb0;
  Message local_ea8;
  bool local_e99;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar__23;
  M check1_4;
  string local_e68;
  AssertHelper local_e48;
  Message local_e40;
  bool local_e31;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar__22;
  SquareMatrix<double> mat1_2;
  undefined1 local_e00 [8];
  M Ytrans;
  RotationY<double> Y_1;
  AssertHelper local_db0;
  Message local_da8;
  SquareMatrix<double> local_da0;
  SquareMatrix<double> local_d90;
  SquareMatrix<double> local_d80;
  bool local_d69;
  undefined1 local_d68 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<double> mat3_1;
  AssertHelper local_d28;
  Message local_d20;
  SquareMatrix<double> local_d18;
  SquareMatrix<double> local_d08;
  bool local_cf1;
  undefined1 local_cf0 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_cc0;
  Message local_cb8;
  SquareMatrix<double> local_cb0;
  SquareMatrix<double> local_ca0;
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<double> mat2_1;
  AssertHelper local_c48;
  Message local_c40;
  bool local_c31;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar__18;
  M check1_3;
  string local_c00;
  AssertHelper local_be0;
  Message local_bd8;
  SquareMatrix<double> local_bd0;
  bool local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar__17;
  SquareMatrix<double> mat1_1;
  PauliX<double> X_2;
  AssertHelper local_b68;
  Message local_b60;
  SquareMatrix<double> local_b58;
  SquareMatrix<double> local_b48;
  SquareMatrix<double> local_b38;
  bool local_b21;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<double> mat3;
  AssertHelper local_ae0;
  Message local_ad8;
  SquareMatrix<double> local_ad0;
  SquareMatrix<double> local_ac0;
  bool local_aa9;
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_a78;
  Message local_a70;
  SquareMatrix<double> local_a68;
  SquareMatrix<double> local_a58;
  bool local_a41;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar__14;
  SquareMatrix<double> mat2;
  AssertHelper local_a00;
  Message local_9f8;
  bool local_9e9;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar__13;
  M check1_2;
  string local_9b8;
  AssertHelper local_998;
  Message local_990;
  SquareMatrix<double> local_988;
  bool local_971;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__12;
  SquareMatrix<double> mat1;
  PauliX<double> X_1;
  AssertHelper local_920;
  Message local_918;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__11;
  string local_8a0;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__10;
  string local_808;
  AssertHelper local_7e8;
  Message local_7e0;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar__9;
  double local_7b8 [9];
  iterator local_770;
  size_type local_768;
  undefined1 local_760 [8];
  V check3_1;
  V vec3_1;
  AssertHelper local_710;
  Message local_708;
  bool local_6f9;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar__8;
  string local_6b8;
  AssertHelper local_698;
  Message local_690;
  bool local_681;
  undefined1 local_680 [8];
  AssertionResult gtest_ar__7;
  double local_668 [5];
  iterator local_640;
  size_type local_638;
  undefined1 local_630 [8];
  V check2_1;
  V vec2_1;
  AssertHelper local_5e0;
  Message local_5d8;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__6;
  double local_5b0 [2];
  iterator local_5a0;
  size_type local_598;
  undefined1 local_590 [8];
  V check1_1;
  V vec1_1;
  RotationY<double> Y;
  AssertHelper local_520;
  Message local_518;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__5;
  string local_4a0;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__4;
  string local_408;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  double local_3b8 [9];
  iterator local_370;
  size_type local_368;
  undefined1 local_360 [8];
  V check3;
  V vec3;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__2;
  string local_2b8;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__1;
  double local_268 [5];
  iterator local_240;
  size_type local_238;
  undefined1 local_230 [8];
  V check2;
  V vec2;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  double local_1b0 [2];
  iterator local_1a0;
  size_type local_198;
  undefined1 local_190 [8];
  V check1;
  V vec1;
  PauliX<double> X;
  double local_148 [8];
  iterator local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  V v3;
  double local_d8 [5];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  V v2;
  double local_80 [2];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  V v1;
  SquareMatrix<double> I3;
  undefined1 local_28 [8];
  SquareMatrix<double> I2;
  SquareMatrix<double> I1;
  
  qclab::dense::eye<double>((dense *)&I2.data_,2);
  qclab::dense::eye<double>((dense *)local_28,4);
  qclab::dense::eye<double>
            ((dense *)&v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,8);
  local_80[0] = 3.0;
  local_80[1] = 5.0;
  local_70 = local_80;
  local_68 = 2;
  paVar1 = (allocator<double> *)
           ((long)&v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_13._M_len = local_68;
  __l_13._M_array = local_70;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,__l_13,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_d8[2] = 2.0;
  local_d8[3] = 7.0;
  local_d8[0] = 3.0;
  local_d8[1] = 5.0;
  local_b0 = local_d8;
  local_a8 = 4;
  paVar1 = (allocator<double> *)
           ((long)&v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_12._M_len = local_a8;
  __l_12._M_array = local_b0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0,__l_12,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_148[6] = 8.0;
  local_148[7] = 3.0;
  local_148[4] = 4.0;
  local_148[5] = 1.0;
  local_148[2] = 2.0;
  local_148[3] = 7.0;
  local_148[0] = 3.0;
  local_148[1] = 5.0;
  local_108 = local_148;
  local_100 = 8;
  this = &X.super_QGate1<double>.field_0xf;
  std::allocator<double>::allocator((allocator<double> *)this);
  __l_11._M_len = local_100;
  __l_11._M_array = local_108;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,__l_11,(allocator_type *)this);
  std::allocator<double>::~allocator((allocator<double> *)&X.super_QGate1<double>.field_0xf);
  qclab::qgates::PauliX<double>::PauliX
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_60);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,1,
             (vector<double,_std::allocator<double>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_1b0[0] = 5.0;
  local_1b0[1] = 3.0;
  local_1a0 = local_1b0;
  local_198 = 2;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_10._M_len = local_198;
  __l_10._M_array = local_1a0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_190,__l_10,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1c9 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_1c8,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string
              ((string *)
               &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_a0);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_268[2] = 3.0;
  local_268[3] = 5.0;
  local_268[0] = 2.0;
  local_268[1] = 7.0;
  local_240 = local_268;
  local_238 = 4;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_09._M_len = local_238;
  __l_09._M_array = local_240;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_230,__l_09,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_281 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2b8,(internal *)local_280,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_a0);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&gtest_ar__2.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_230,__l_08);
  local_2f9 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_2f8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_3b8[6] = 4.0;
  local_3b8[7] = 1.0;
  local_3b8[4] = 8.0;
  local_3b8[5] = 3.0;
  local_3b8[2] = 3.0;
  local_3b8[3] = 5.0;
  local_3b8[0] = 2.0;
  local_3b8[1] = 7.0;
  local_370 = local_3b8;
  local_368 = 8;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_07._M_len = local_368;
  __l_07._M_array = local_370;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_360,__l_07,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_3d1 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_408,(internal *)local_3d0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  __l_06._M_len = 8;
  __l_06._M_array = (iterator)&gtest_ar__4.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_360,__l_06);
  local_469 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar2) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4a0,(internal *)local_468,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&gtest_ar__5.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_360,__l_05);
  local_509 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_508,&local_509,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar2) {
    testing::Message::Message(&local_518);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y.super_QRotationGate1<double>.rotation_.angle_.sin_,(internal *)local_508
               ,(AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    std::__cxx11::string::~string((string *)&Y.super_QRotationGate1<double>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_360);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_230);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_190);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<double>::~PauliX
            ((PauliX<double> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<double>::RotationY
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,0.0,1.0,false);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_60);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<double,_std::allocator<double>_> *)
             &check1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_5b0[0] = 5.0;
  local_5b0[1] = -3.0;
  local_5a0 = local_5b0;
  local_598 = 2;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__6.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_04._M_len = local_598;
  __l_04._M_array = local_5a0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_590,__l_04,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_5c9 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_590);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar2) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_5c8,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string
              ((string *)
               &vec2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_a0);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<double,_std::allocator<double>_> *)
             &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_668[2] = -3.0;
  local_668[3] = -5.0;
  local_668[0] = 2.0;
  local_668[1] = 7.0;
  local_640 = local_668;
  local_638 = 4;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_03._M_len = local_638;
  __l_03._M_array = local_640;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_630,__l_03,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_681 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_630);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_680,&local_681,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar2) {
    testing::Message::Message(&local_690);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)local_680,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_698,&local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    std::__cxx11::string::~string((string *)&local_6b8);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_a0);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<double,_std::allocator<double>_> *)
             &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&gtest_ar__8.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_630,__l_02);
  local_6f9 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_630);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f8,&local_6f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar2) {
    testing::Message::Message(&local_708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_6f8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_710,&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    std::__cxx11::string::~string
              ((string *)
               &vec3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_7b8[6] = -4.0;
  local_7b8[7] = -1.0;
  local_7b8[4] = 8.0;
  local_7b8[5] = 3.0;
  local_7b8[2] = -3.0;
  local_7b8[3] = -5.0;
  local_7b8[0] = 2.0;
  local_7b8[1] = 7.0;
  local_770 = local_7b8;
  local_768 = 8;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_01._M_len = local_768;
  __l_01._M_array = local_770;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_760,__l_01,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_7d1 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar2) {
    testing::Message::Message(&local_7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_808,(internal *)local_7d0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e8,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&gtest_ar__10.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_760,__l_00);
  local_869 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_868,&local_869,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar2) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8a0,(internal *)local_868,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  qclab::qgates::QGate1<double>::setQubit
            ((QGate1<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_f8);
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4014000000000000;
  __l._M_len = 8;
  __l._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_760,__l);
  local_909 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar2) {
    testing::Message::Message(&local_918);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_1.super_QGate1<double>.qubit_,(internal *)local_908,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    std::__cxx11::string::~string((string *)&X_1.super_QGate1<double>.qubit_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_760);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_630);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check2_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_590);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<double>::~RotationY
            ((RotationY<double> *)
             &vec1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<double>::PauliX((PauliX<double> *)&mat1.data_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__12.message_,(SquareMatrix<double> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<double> *)&gtest_ar__12.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_988);
  local_971 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__12.message_,&local_988);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_970,&local_971,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_988);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar2) {
    testing::Message::Message(&local_990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9b8,(internal *)local_970,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check1_2.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__12.message_,(SquareMatrix<double> *)&check1_2.data_)
  ;
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&check1_2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<double> *)&gtest_ar__12.message_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__13.message_,3.0,2.0,7.0,5.0);
  local_9e9 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__12.message_,
                         (SquareMatrix<double> *)&gtest_ar__13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9e8,&local_9e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar2) {
    testing::Message::Message(&local_9f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2.data_,(internal *)local_9e8,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper(&local_a00);
    std::__cxx11::string::~string((string *)&mat2.data_);
    testing::Message::~Message(&local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__14.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_a68);
  qclab::dense::kron<double>((dense *)&local_a58,&local_a68,(SquareMatrix<double> *)&I2.data_);
  local_a41 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__14.message_,&local_a58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a40,&local_a41,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_a58);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_a68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar2) {
    testing::Message::Message(&local_a70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_a40,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a78,&local_a70);
    testing::internal::AssertHelper::~AssertHelper(&local_a78);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  qclab::qgates::QGate1<double>::setQubit((QGate1<double> *)&mat1.data_,1);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__14.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_ad0);
  qclab::dense::kron<double>((dense *)&local_ac0,(SquareMatrix<double> *)&I2.data_,&local_ad0);
  local_aa9 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__14.message_,&local_ac0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa8,&local_aa9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_ac0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_ad0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa8);
  if (!bVar2) {
    testing::Message::Message(&local_ad8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_aa8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ae0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ae0,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper(&local_ae0);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__16.message_,
             (SquareMatrix<double> *)
             &v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1.data_,Left,NoTrans,3,
             (SquareMatrix<double> *)&gtest_ar__16.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_b58);
  qclab::dense::kron<double>((dense *)&local_b48,&local_b58,(SquareMatrix<double> *)&I2.data_);
  qclab::dense::kron<double>((dense *)&local_b38,(SquareMatrix<double> *)&I2.data_,&local_b48);
  local_b21 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__16.message_,&local_b38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b20,&local_b21,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_b38);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_b48);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_b58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar2) {
    testing::Message::Message(&local_b60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_2.super_QGate1<double>.qubit_,(internal *)local_b20,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
    testing::internal::AssertHelper::~AssertHelper(&local_b68);
    std::__cxx11::string::~string((string *)&X_2.super_QGate1<double>.qubit_);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__16.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__14.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__13.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__12.message_);
  qclab::qgates::PauliX<double>::~PauliX((PauliX<double> *)&mat1.data_);
  qclab::qgates::PauliX<double>::PauliX((PauliX<double> *)&mat1_1.data_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__17.message_,(SquareMatrix<double> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<double> *)&gtest_ar__17.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_bd0);
  local_bb9 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__17.message_,&local_bd0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb8,&local_bb9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_bd0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar2) {
    testing::Message::Message(&local_bd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c00,(internal *)local_bb8,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_be0,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper(&local_be0);
    std::__cxx11::string::~string((string *)&local_c00);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check1_3.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__17.message_,(SquareMatrix<double> *)&check1_3.data_)
  ;
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&check1_3.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<double> *)&gtest_ar__17.message_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__18.message_,5.0,7.0,2.0,3.0);
  local_c31 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__17.message_,
                         (SquareMatrix<double> *)&gtest_ar__18.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c30,&local_c31,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
  if (!bVar2) {
    testing::Message::Message(&local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_1.data_,(internal *)local_c30,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)&mat2_1.data_);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__19.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_cb0);
  qclab::dense::kron<double>((dense *)&local_ca0,&local_cb0,(SquareMatrix<double> *)&I2.data_);
  local_c89 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__19.message_,&local_ca0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_ca0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_cb0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
  if (!bVar2) {
    testing::Message::Message(&local_cb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_c88,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_cc0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
  qclab::qgates::QGate1<double>::setQubit((QGate1<double> *)&mat1_1.data_,1);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__19.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_d18);
  qclab::dense::kron<double>((dense *)&local_d08,(SquareMatrix<double> *)&I2.data_,&local_d18);
  local_cf1 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__19.message_,&local_d08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cf0,&local_cf1,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_d08);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_d18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf0);
  if (!bVar2) {
    testing::Message::Message(&local_d20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_1.data_,(internal *)local_cf0,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d28,&local_d20);
    testing::internal::AssertHelper::~AssertHelper(&local_d28);
    std::__cxx11::string::~string((string *)&mat3_1.data_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__21.message_,
             (SquareMatrix<double> *)
             &v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&mat1_1.data_,Right,NoTrans,3,
             (SquareMatrix<double> *)&gtest_ar__21.message_,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&local_da0);
  qclab::dense::kron<double>((dense *)&local_d90,&local_da0,(SquareMatrix<double> *)&I2.data_);
  qclab::dense::kron<double>((dense *)&local_d80,(SquareMatrix<double> *)&I2.data_,&local_d90);
  local_d69 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__21.message_,&local_d80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d68,&local_d69,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_d80);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_d90);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_da0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d68);
  if (!bVar2) {
    testing::Message::Message(&local_da8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_,
               (internal *)local_d68,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_db0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=(&local_db0,&local_da8);
    testing::internal::AssertHelper::~AssertHelper(&local_db0);
    std::__cxx11::string::~string((string *)&Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_)
    ;
    testing::Message::~Message(&local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d68);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__18.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__17.message_);
  qclab::qgates::PauliX<double>::~PauliX((PauliX<double> *)&mat1_1.data_);
  qclab::qgates::RotationY<double>::RotationY((RotationY<double> *)&Ytrans.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<double>::matrix((RotationY<double> *)&mat1_2.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<double>>
            ((dense *)local_e00,(SquareMatrix<double> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__22.message_,(SquareMatrix<double> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<double> *)&gtest_ar__22.message_,0);
  local_e31 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__22.message_,
                         (SquareMatrix<double> *)local_e00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e30,&local_e31,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar2) {
    testing::Message::Message(&local_e40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e68,(internal *)local_e30,(AssertionResult *)"mat1 == Ytrans","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
    testing::internal::AssertHelper::~AssertHelper(&local_e48);
    std::__cxx11::string::~string((string *)&local_e68);
    testing::Message::~Message(&local_e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check1_4.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__22.message_,(SquareMatrix<double> *)&check1_4.data_)
  ;
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&check1_4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<double> *)&gtest_ar__22.message_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__23.message_,-3.0,2.0,-7.0,5.0);
  local_e99 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__22.message_,
                         (SquareMatrix<double> *)&gtest_ar__23.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e98,&local_e99,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar2) {
    testing::Message::Message(&local_ea8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_2.data_,(internal *)local_e98,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_eb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_eb0,&local_ea8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb0);
    std::__cxx11::string::~string((string *)&mat2_2.data_);
    testing::Message::~Message(&local_ea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__24.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<double> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_f08,(SquareMatrix<double> *)local_e00,(SquareMatrix<double> *)&I2.data_
            );
  local_ef1 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__24.message_,&local_f08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ef0,&local_ef1,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_f08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef0);
  if (!bVar2) {
    testing::Message::Message(&local_f10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_ef0,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f18,&local_f10);
    testing::internal::AssertHelper::~AssertHelper(&local_f18);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_f10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
  qclab::qgates::QGate1<double>::setQubit((QGate1<double> *)&Ytrans.data_,1);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__24.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<double> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_f60,(SquareMatrix<double> *)&I2.data_,(SquareMatrix<double> *)local_e00
            );
  local_f49 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__24.message_,&local_f60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f48,&local_f49,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_f60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f48);
  if (!bVar2) {
    testing::Message::Message(&local_f68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_2.data_,(internal *)local_f48,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f70,&local_f68);
    testing::internal::AssertHelper::~AssertHelper(&local_f70);
    std::__cxx11::string::~string((string *)&mat3_2.data_);
    testing::Message::~Message(&local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f48);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__26.message_,
             (SquareMatrix<double> *)
             &v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans.data_,Left,Trans,3,
             (SquareMatrix<double> *)&gtest_ar__26.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_fd8,(SquareMatrix<double> *)local_e00,(SquareMatrix<double> *)&I2.data_
            );
  qclab::dense::kron<double>((dense *)&local_fc8,(SquareMatrix<double> *)&I2.data_,&local_fd8);
  local_fb1 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__26.message_,&local_fc8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fb0,&local_fb1,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_fc8);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_fd8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb0);
  if (!bVar2) {
    testing::Message::Message(&local_fe0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_2.super_QRotationGate1<double>.rotation_.angle_.sin_,
               (internal *)local_fb0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fe8,&local_fe0);
    testing::internal::AssertHelper::~AssertHelper(&local_fe8);
    std::__cxx11::string::~string((string *)&Y_2.super_QRotationGate1<double>.rotation_.angle_.sin_)
    ;
    testing::Message::~Message(&local_fe0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__24.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__23.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__22.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_e00);
  qclab::qgates::RotationY<double>::~RotationY((RotationY<double> *)&Ytrans.data_);
  qclab::qgates::RotationY<double>::RotationY((RotationY<double> *)&Ytrans_1.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<double>::matrix((RotationY<double> *)&mat1_3.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<double>>
            ((dense *)local_1038,(SquareMatrix<double> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__27.message_,(SquareMatrix<double> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<double> *)&gtest_ar__27.message_,0);
  local_1069 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__27.message_,
                          (SquareMatrix<double> *)local_1038);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1068,&local_1069,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar2) {
    testing::Message::Message(&local_1078);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10a0,(internal *)local_1068,(AssertionResult *)"mat1 == Ytrans","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1080,&local_1078);
    testing::internal::AssertHelper::~AssertHelper(&local_1080);
    std::__cxx11::string::~string((string *)&local_10a0);
    testing::Message::~Message(&local_1078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check1_5.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__27.message_,(SquareMatrix<double> *)&check1_5.data_)
  ;
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&check1_5.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<double> *)&gtest_ar__27.message_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__28.message_,5.0,7.0,-2.0,-3.0);
  local_10d1 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__27.message_,
                          (SquareMatrix<double> *)&gtest_ar__28.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10d0,&local_10d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar2) {
    testing::Message::Message(&local_10e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_3.data_,(internal *)local_10d0,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10e8,&local_10e0);
    testing::internal::AssertHelper::~AssertHelper(&local_10e8);
    std::__cxx11::string::~string((string *)&mat2_3.data_);
    testing::Message::~Message(&local_10e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__29.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<double> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_1140,(SquareMatrix<double> *)local_1038,
             (SquareMatrix<double> *)&I2.data_);
  local_1129 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__29.message_,&local_1140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1128,&local_1129,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1140);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
  if (!bVar2) {
    testing::Message::Message(&local_1148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_1128,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1150,&local_1148);
    testing::internal::AssertHelper::~AssertHelper(&local_1150);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
  qclab::qgates::QGate1<double>::setQubit((QGate1<double> *)&Ytrans_1.data_,1);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__29.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<double> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_1198,(SquareMatrix<double> *)&I2.data_,
             (SquareMatrix<double> *)local_1038);
  local_1181 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__29.message_,&local_1198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1180,&local_1181,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1198);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1180);
  if (!bVar2) {
    testing::Message::Message(&local_11a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_3.data_,(internal *)local_1180,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    std::__cxx11::string::~string((string *)&mat3_3.data_);
    testing::Message::~Message(&local_11a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__31.message_,
             (SquareMatrix<double> *)
             &v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply
            ((RotationY<double> *)&Ytrans_1.data_,Right,Trans,3,
             (SquareMatrix<double> *)&gtest_ar__31.message_,0);
  qclab::dense::kron<double>
            ((dense *)&local_1210,(SquareMatrix<double> *)local_1038,
             (SquareMatrix<double> *)&I2.data_);
  qclab::dense::kron<double>((dense *)&local_1200,(SquareMatrix<double> *)&I2.data_,&local_1210);
  local_11e9 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__31.message_,&local_1200);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_11e8,&local_11e9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1200);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1210);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e8);
  if (!bVar2) {
    testing::Message::Message(&local_1218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1240,(internal *)local_11e8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1220,&local_1218);
    testing::internal::AssertHelper::~AssertHelper(&local_1220);
    std::__cxx11::string::~string((string *)&local_1240);
    testing::Message::~Message(&local_1218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e8);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__31.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__29.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__28.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__27.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_1038);
  qclab::qgates::RotationY<double>::~RotationY((RotationY<double> *)&Ytrans_1.data_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_f8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  qclab::dense::SquareMatrix<double>::~SquareMatrix
            ((SquareMatrix<double> *)
             &v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_28);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}